

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_smsb.hpp
# Opt level: O3

uint32_t ans_smsb_mapping(uint32_t x)

{
  if (x < 0x101) {
    return x;
  }
  if (x < 0x10001) {
    return (x >> 8) + 0x100;
  }
  if (x < 0x1000001) {
    return x >> 0x10 | 0x200;
  }
  return x >> 0x18 | 0x300;
}

Assistant:

uint32_t ans_smsb_mapping(uint32_t x)
{
    if (x <= 256)
        return x;
    if (x <= (1 << 16))
        return (x >> 8) + 256;
    if (x <= (1 << 24))
        return (x >> 16) + 512;
    return (x >> 24) + 768;
}